

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O1

TestLog * __thiscall tcu::MessageBuilder::operator<<(MessageBuilder *this,EndMessageToken *param_1)

{
  TestLog *this_00;
  long *local_38;
  long local_28 [2];
  
  this_00 = this->m_log;
  std::__cxx11::stringbuf::str();
  TestLog::writeMessage(this_00,(char *)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return this->m_log;
}

Assistant:

TestLog& MessageBuilder::operator<< (const TestLog::EndMessageToken&)
{
	m_log->writeMessage(m_str.str().c_str());
	return *m_log;
}